

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

void __thiscall
wasm::IRBuilder::fixLoopWithInput(IRBuilder *this,Loop *loop,Type inputType,Index scratch)

{
  Name *pNVar1;
  Expression *any;
  string_view label;
  string_view name;
  string_view name_00;
  optional<wasm::Type> type;
  size_t sVar2;
  char *pcVar3;
  Block *pBVar4;
  Break *append;
  Builder *this_00;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  initializer_list<wasm::Expression_*> local_90;
  Break *local_80;
  Break *local_78;
  _Storage<wasm::Type,_true> local_70;
  undefined1 uStack_68;
  undefined7 uStack_67;
  string_view local_60;
  string_view local_50;
  _Storage<wasm::Type,_true> local_40;
  Index local_34;
  
  pNVar1 = &loop->name;
  name_00 = (pNVar1->super_IString).str;
  name = (pNVar1->super_IString).str;
  label = (pNVar1->super_IString).str;
  local_40 = (_Storage<wasm::Type,_true>)inputType.id;
  local_34 = scratch;
  local_60 = (string_view)makeFresh(this,(Name)(pNVar1->super_IString).str,0);
  local_50 = (string_view)makeFresh(this,(Name)label,1);
  this_00 = &this->builder;
  any = loop->body;
  if ((loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id == 0) {
    append = Builder::makeBreak(this_00,(Name)local_50,(Expression *)0x0,(Expression *)0x0);
    local_70._M_value.id = (Type)(Type)local_40;
    uStack_68 = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = uStack_67;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = true;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)local_40;
    pBVar4 = Builder::blockifyWithName(this_00,any,(Name)name_00,(Expression *)append,type);
  }
  else {
    local_80 = Builder::makeBreak(this_00,(Name)local_50,any,(Expression *)0x0);
    local_90._M_array = (iterator)&local_80;
    local_90._M_len = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)local_40;
    pBVar4 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this_00,(Name)name,&local_90,type_00);
  }
  local_80 = (Break *)Builder::makeLocalSet(this_00,local_34,(Expression *)pBVar4);
  sVar2 = local_60._M_len;
  pcVar3 = local_60._M_str;
  local_78 = Builder::makeBreak(this_00,(Name)local_60,(Expression *)0x0,(Expression *)0x0);
  local_90._M_len = 2;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)
       (loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id;
  local_90._M_array = (iterator)&local_80;
  pBVar4 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                     (this_00,(Name)local_50,&local_90,type_01);
  loop->body = (Expression *)pBVar4;
  (loop->name).super_IString.str._M_len = sVar2;
  (loop->name).super_IString.str._M_str = pcVar3;
  return;
}

Assistant:

void IRBuilder::fixLoopWithInput(Loop* loop, Type inputType, Index scratch) {
  auto l = loop->name;
  auto l0 = makeFresh(l, 0);
  auto l1 = makeFresh(l, 1);

  Block* inner =
    loop->type == Type::none
      ? builder.blockifyWithName(
          loop->body, l, builder.makeBreak(l1), inputType)
      : builder.makeBlock(l, {builder.makeBreak(l1, loop->body)}, inputType);

  Block* outer = builder.makeBlock(
    l1,
    {builder.makeLocalSet(scratch, inner), builder.makeBreak(l0)},
    loop->type);

  loop->body = outer;
  loop->name = l0;
}